

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase273::run(TestCase273 *this)

{
  _func_int ***ppp_Var1;
  _func_int ***ppp_Var2;
  Disposer *pDVar3;
  undefined8 uVar4;
  PromiseNode *pPVar5;
  TransformPromiseNodeBase *this_00;
  Promise<void> PVar6;
  WaitScope waitScope;
  EventLoop loop;
  Own<kj::_::PromiseNode> local_1e8;
  Promise<void> local_1d8;
  WaitScope local_1c8;
  ExceptionOrValue local_1b8;
  char local_58;
  EventLoop local_48;
  
  EventLoop::EventLoop(&local_48);
  local_1c8.busyPollInterval = 0xffffffff;
  local_1c8.loop = &local_48;
  EventLoop::enterScope(&local_48);
  local_1e8.disposer = (Disposer *)0x0;
  local_1e8.ptr = (PromiseNode *)0x0;
  _::yield();
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)&local_1b8,
             _::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:278:23),_kj::_::PropagateException>
             ::anon_class_8_1_70ebebfb_for_func::operator());
  uVar4 = local_1b8.exception.ptr.field_1.value.ownFile.content.ptr;
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00434c70;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&local_1e8;
  if ((PromiseNode *)local_1b8.exception.ptr.field_1.value.ownFile.content.ptr != (PromiseNode *)0x0
     ) {
    local_1b8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_1b8.exception.ptr._4_4_,local_1b8.exception.ptr._0_4_)
    )((undefined8 *)CONCAT44(local_1b8.exception.ptr._4_4_,local_1b8.exception.ptr._0_4_),
      (char *)(uVar4 + (long)(*(_func_int ***)uVar4)[-2]));
  }
  pDVar3 = local_1e8.disposer;
  local_1e8.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase273::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_1d8.super_PromiseBase.node.ptr = (PromiseNode *)this_00;
  if (local_1e8.ptr != (PromiseNode *)0x0) {
    ppp_Var1 = &(local_1e8.ptr)->_vptr_PromiseNode;
    ppp_Var2 = &(local_1e8.ptr)->_vptr_PromiseNode;
    local_1e8.ptr = (PromiseNode *)this_00;
    (**pDVar3->_vptr_Disposer)(pDVar3,(*ppp_Var1)[-2] + (long)ppp_Var2);
    local_1d8.super_PromiseBase.node.ptr = local_1e8.ptr;
  }
  local_1e8.ptr = (PromiseNode *)0x0;
  local_1d8.super_PromiseBase.node.disposer = local_1e8.disposer;
  PVar6 = makeChain2((anon_unknown_0 *)&local_1b8,1000,&local_1d8);
  pDVar3 = local_1e8.disposer;
  local_1e8.disposer =
       (Disposer *)CONCAT44(local_1b8.exception.ptr._4_4_,local_1b8.exception.ptr._0_4_);
  pPVar5 = (PromiseNode *)local_1b8.exception.ptr.field_1.value.ownFile.content.ptr;
  local_1b8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
  if (local_1e8.ptr != (PromiseNode *)0x0) {
    ppp_Var1 = &(local_1e8.ptr)->_vptr_PromiseNode;
    ppp_Var2 = &(local_1e8.ptr)->_vptr_PromiseNode;
    local_1e8.ptr = pPVar5;
    (**pDVar3->_vptr_Disposer)
              (pDVar3,(*ppp_Var1)[-2] + (long)ppp_Var2,PVar6.super_PromiseBase.node.ptr);
    pPVar5 = local_1e8.ptr;
  }
  local_1e8.ptr = pPVar5;
  pPVar5 = local_1d8.super_PromiseBase.node.ptr;
  if ((TransformPromiseNodeBase *)local_1d8.super_PromiseBase.node.ptr !=
      (TransformPromiseNodeBase *)0x0) {
    local_1d8.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (**(local_1d8.super_PromiseBase.node.disposer)->_vptr_Disposer)
              (local_1d8.super_PromiseBase.node.disposer,
               ((PromiseNode *)&pPVar5->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar5->_vptr_PromiseNode)->_vptr_PromiseNode);
  }
  local_1b8.exception.ptr._0_4_ = local_1b8.exception.ptr._0_4_ & 0xffffff00;
  local_58 = '\0';
  _::waitImpl(&local_1e8,&local_1b8,&local_1c8);
  if (local_58 == '\x01') {
    if ((anon_unknown_0)local_1b8.exception.ptr.isSet != (anon_unknown_0)0x0) {
      throwRecoverableException(&local_1b8.exception.ptr.field_1.value,0);
    }
  }
  else {
    if ((anon_unknown_0)local_1b8.exception.ptr.isSet == (anon_unknown_0)0x0) {
      _::unreachable();
    }
    throwRecoverableException(&local_1b8.exception.ptr.field_1.value,0);
  }
  if ((anon_unknown_0)local_1b8.exception.ptr.isSet == (anon_unknown_0)0x1) {
    Exception::~Exception(&local_1b8.exception.ptr.field_1.value);
  }
  pPVar5 = local_1e8.ptr;
  if (local_1e8.ptr != (PromiseNode *)0x0) {
    local_1e8.ptr = (PromiseNode *)0x0;
    (**(local_1e8.disposer)->_vptr_Disposer)
              (local_1e8.disposer,pPVar5->_vptr_PromiseNode[-2] + (long)&pPVar5->_vptr_PromiseNode);
  }
  EventLoop::leaveScope(local_1c8.loop);
  EventLoop::~EventLoop(&local_48);
  return;
}

Assistant:

TEST(Async, DeepChain4) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<void> promise = nullptr;
  promise = evalLater([&]() {
    auto trace = promise.trace();
    uint lines = 0;
    for (char c: trace) {
      lines += c == '\n';
    }

    // Chain nodes should have been collapsed such that instead of a chain of 1000 nodes, we have
    // 2-ish nodes.  We'll give a little room for implementation freedom.
    EXPECT_LT(lines, 5);
  });

  promise = makeChain2(1000, kj::mv(promise));

  promise.wait(waitScope);
}